

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void bootstrap_set_system(ecs_world_t *world,char *name,char *expr,ecs_iter_action_t action)

{
  ecs_query_t *query_00;
  ecs_query_t *query;
  undefined8 local_58;
  undefined8 local_50;
  ecs_entity_t local_48;
  ecs_entity_t sys;
  ecs_sig_t sig;
  ecs_iter_action_t action_local;
  char *expr_local;
  char *name_local;
  ecs_world_t *world_local;
  
  sig.columns = (ecs_vector_t *)action;
  memset(&sys,0,0x18);
  local_58 = 0;
  local_50 = 0;
  query = (ecs_query_t *)name;
  local_48 = ecs_set_ptr_w_entity(world,0,6,0x18,&query);
  ecs_add_entity(world,local_48,0x10b);
  ecs_sig_init(world,name,expr,(ecs_sig_t *)&sys);
  query_00 = ecs_query_new_w_sig(world,local_48,(ecs_sig_t *)&sys);
  ecs_init_system(world,local_48,(ecs_iter_action_t)sig.columns,query_00,(void *)0x0);
  return;
}

Assistant:

static
void bootstrap_set_system(
    ecs_world_t *world,
    const char *name,
    const char *expr,
    ecs_iter_action_t action)
{
    ecs_sig_t sig = {0};
    ecs_entity_t sys = ecs_set(world, 0, EcsName, {.value = name});
    ecs_add_entity(world, sys, EcsOnSet);
    ecs_sig_init(world, name, expr, &sig);
    ecs_query_t *query = ecs_query_new_w_sig(world, sys, &sig);
    ecs_init_system(world, sys, action, query, NULL);
}